

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  type tVar6;
  type tVar7;
  byte *pbVar8;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  size_t count;
  ulong uVar15;
  char *__s;
  char local_37 [8];
  char format [7];
  
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x47e,"empty buffer");
  }
  iVar14 = 5;
  if (-1 < precision) {
    iVar14 = precision + -1;
  }
  bVar12 = specs._4_1_;
  if (1 < bVar12) {
    iVar14 = precision;
  }
  local_37[0] = '%';
  uVar13 = specs._4_4_;
  if (bVar12 == 3 && (uVar13 >> 0x14 & 1) != 0) {
    pbVar8 = (byte *)(local_37 + 2);
    local_37[1] = 0x23;
  }
  else {
    pbVar8 = (byte *)(local_37 + 1);
  }
  if (-1 < iVar14) {
    pbVar8[0] = 0x2e;
    pbVar8[1] = 0x2a;
    pbVar8 = pbVar8 + 2;
  }
  if (bVar12 == 3) {
    bVar10 = ((uVar13 >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar10 = (bVar12 == 2) + 0x65;
  }
  *pbVar8 = bVar10;
  pbVar8[1] = 0;
  sVar3 = buf->size_;
LAB_00209fce:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar15 = buf->capacity_ - sVar3;
    if (iVar14 < 0) {
      iVar5 = snprintf(__s,uVar15,local_37,value);
    }
    else {
      iVar5 = snprintf(__s,uVar15,local_37,value);
    }
    if (iVar5 < 0) goto LAB_0020a026;
    tVar6 = to_unsigned<int>(iVar5);
    count = (size_t)tVar6;
    if (count < uVar15) break;
    uVar15 = count + sVar3 + 1;
    if (buf->capacity_ < uVar15) goto LAB_0020a033;
  }
  if (bVar12 == 2) {
    if (precision != 0) {
      uVar15 = 1;
      do {
        lVar11 = uVar15 + (count - 2);
        uVar15 = uVar15 - 1;
      } while ((byte)(__s[lVar11] - 0x30U) < 10);
      tVar7 = to_unsigned<int>(-(int)uVar15);
      memmove(__s + uVar15 + count + -1,__s + uVar15 + count,(ulong)tVar7);
      buffer<char>::try_resize(buf,(ulong)(tVar6 - 1));
      goto LAB_0020a182;
    }
  }
  else {
    if ((uVar13 & 0xff) != 3) {
      lVar11 = 2;
      do {
        lVar1 = lVar11 + (count - 3);
        lVar11 = lVar11 + -1;
      } while (__s[lVar1] != 'e');
      lVar1 = count + lVar11;
      cVar2 = __s[lVar1 + -1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        __assert_fail("sign == \'+\' || sign == \'-\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                      ,0x4cc,
                      "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                     );
      }
      pcVar9 = __s + lVar11 + count + -3;
      iVar14 = tVar6 + (int)lVar11 + -3;
      iVar5 = 0;
      do {
        if (9 < (byte)(__s[lVar11 + count] - 0x30U)) {
          __assert_fail("is_digit(*p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                        ,0x4d0,
                        "int fmt::detail::snprintf_float(T, int, float_specs, buffer<char> &) [T = double]"
                       );
        }
        iVar5 = iVar5 * 10 + (uint)(byte)__s[lVar11 + count] + -0x30;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0);
      iVar4 = -iVar5;
      if (cVar2 != '-') {
        iVar4 = iVar5;
      }
      iVar5 = 0;
      if (lVar1 != 3) {
        do {
          iVar14 = iVar14 + -1;
          cVar2 = *pcVar9;
          pcVar9 = pcVar9 + -1;
        } while (cVar2 == '0');
        tVar6 = to_unsigned<int>(iVar14);
        memmove(__s + 1,__s + 2,(ulong)tVar6);
        iVar5 = iVar14;
      }
      tVar6 = to_unsigned<int>(iVar5);
      buffer<char>::try_resize(buf,sVar3 + 1 + (ulong)tVar6);
      uVar15 = (ulong)(uint)(iVar4 - iVar5);
      goto LAB_0020a182;
    }
    count = sVar3 + count;
  }
  buffer<char>::try_resize(buf,count);
  uVar15 = 0;
LAB_0020a182:
  return (int)uVar15;
LAB_0020a026:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar15 = buf->capacity_ + 1;
LAB_0020a033:
    (**buf->_vptr_buffer)(buf,uVar15);
  }
  goto LAB_00209fce;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}